

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppPrinter.cpp
# Opt level: O2

void __thiscall hdc::CppPrinter::visit(CppPrinter *this,LiteralIntegerExpression *expression)

{
  string *psVar1;
  undefined1 local_40 [48];
  
  this->isExpression = true;
  LiteralExpression::get_token((Token *)local_40,&expression->super_LiteralExpression);
  psVar1 = Token::getLexem_abi_cxx11_((Token *)local_40);
  std::operator<<((ostream *)&this->field_0x20,(string *)psVar1);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return;
}

Assistant:

void CppPrinter::visit(LiteralIntegerExpression* expression) {
    isExpression = true;
    output << expression->get_token().getLexem();
}